

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O0

int fmt::v7::detail::dragonbox::floor_log2_pow10(int e)

{
  int shift_amount;
  uint64_t log2_10_fractional_digits;
  uint64_t log2_10_integer_part;
  int e_local;
  
  if ((e < 0x4d2) && (-0x4d2 < e)) {
    return e * 0x1a934f >> 0x13;
  }
  assert_fail("/workspace/llm4binary/github/license_c_cmakelists/quesnel[P]baryonyx/external/fmt/include/fmt/format-inl.h"
              ,0x6c3,"too large exponent");
}

Assistant:

inline int floor_log2_pow10(int e) FMT_NOEXCEPT {
  FMT_ASSERT(e <= 1233 && e >= -1233, "too large exponent");
  const uint64_t log2_10_integer_part = 3;
  const uint64_t log2_10_fractional_digits = 0x5269e12f346e2bf9;
  const int shift_amount = 19;
  return (e * static_cast<int>(
                  (log2_10_integer_part << shift_amount) |
                  (log2_10_fractional_digits >> (64 - shift_amount)))) >>
         shift_amount;
}